

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O0

void encode_sb_row(AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,int mi_row,
                  TokenExtra **tp)

{
  _Bool _Var1;
  _Bool _Var2;
  int16_t (*paiVar3) [8];
  byte bVar4;
  byte bVar5;
  int iVar6;
  int mi_row_00;
  int iVar7;
  int iVar8;
  CB_COEFF_BUFFER *pCVar9;
  segmentation *seg_00;
  int in_ECX;
  TileInfo *in_RDX;
  AV1_COMP *in_RSI;
  AV1_COMP *in_RDI;
  int in_stack_00000028;
  int in_stack_0000002c;
  TokenExtra **in_stack_00000030;
  TileDataEnc *in_stack_00000038;
  ThreadData_conflict *in_stack_00000040;
  uint8_t segment_id;
  uint8_t *map;
  int seg_skip;
  segmentation *seg;
  int wt_tr;
  int wt_left;
  int update_cdf;
  _Bool row_mt_exit;
  int sb_col_in_tile;
  int mi_col;
  int use_nonrd_mode;
  int sb_row;
  int mib_size_log2;
  int mib_size;
  BLOCK_SIZE sb_size;
  int sb_cols_in_tile;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  _Bool row_mt_enabled;
  AV1EncRowMultiThreadSync *row_mt_sync;
  AV1EncRowMultiThreadInfo *enc_row_mt;
  MultiThreadInfo *mt_info;
  TileInfo *tile_info;
  AV1_COMMON *cm;
  int in_stack_00000610;
  int in_stack_00000614;
  FRAME_CONTEXT *in_stack_00000618;
  FRAME_CONTEXT *in_stack_00000620;
  int in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  uint in_stack_ffffffffffffff14;
  AV1_COMP *in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff20;
  uint uVar10;
  char cVar11;
  MACROBLOCK *x_00;
  undefined4 in_stack_ffffffffffffff30;
  _func_void_AV1EncRowMultiThreadSync_ptr_int_int *p_Var12;
  ThreadData_conflict *in_stack_ffffffffffffff40;
  ThreadData_conflict *xd_00;
  undefined7 in_stack_ffffffffffffff48;
  uint8_t in_stack_ffffffffffffff4f;
  AV1_COMP *in_stack_ffffffffffffff50;
  int local_a4;
  int local_88;
  int local_84;
  int mi_col_00;
  int iVar13;
  int iVar14;
  int iVar15;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar16;
  ThreadData_conflict *pTVar17;
  AV1_COMP *cpi_00;
  MACROBLOCK *pMVar18;
  
  x_00 = (MACROBLOCK *)&in_RDX[0x3de].mi_col_start;
  _Var1 = (in_RDI->mt_info).row_mt_enabled;
  bVar4 = _Var1 & 1;
  xd_00 = (ThreadData_conflict *)((in_RSI->enc_quant_dequant_params).quants.y_quant + 0x19);
  cpi_00 = in_RSI;
  iVar6 = av1_get_sb_cols_in_tile(&in_RDI->common,in_RDX);
  uVar16 = CONCAT13(((in_RDI->common).seq_params)->sb_size,(int3)in_stack_ffffffffffffff90);
  iVar15 = ((in_RDI->common).seq_params)->mib_size;
  iVar14 = ((in_RDI->common).seq_params)->mib_size_log2;
  mi_row_00 = in_ECX - in_RDX->mi_row_start >> ((byte)iVar14 & 0x1f);
  mi_col_00 = (in_RDI->sf).rt_sf.use_nonrd_pick_mode;
  av1_zero_left_context((MACROBLOCKD *)0x209172);
  local_a4 = in_stack_ffffffffffffff08;
  pTVar17 = xd_00;
  if ((in_ECX == in_RDX->mi_row_start) || (bVar4 != 0)) {
    if ((in_RDI->common).delta_q_info.delta_q_present_flag != 0) {
      *(int *)((xd_00->mb).e_mbd.weight[8] + 6) = (in_RDI->common).quant_params.base_qindex;
    }
    if ((in_RDI->common).delta_q_info.delta_lf_present_flag != 0) {
      iVar7 = av1_num_planes(&in_RDI->common);
      av1_reset_loop_filter_delta((MACROBLOCKD *)xd_00,iVar7);
      local_a4 = in_stack_ffffffffffffff08;
      in_stack_ffffffffffffff40 = xd_00;
    }
  }
  reset_thresh_freq_fact((MACROBLOCK *)cpi_00);
  local_84 = in_RDX->mi_col_start;
  local_88 = 0;
  do {
    if (in_RDX->mi_col_end <= local_84) {
      return;
    }
    p_Var12 = (in_RDI->mt_info).enc_row_mt.sync_read_ptr;
    iVar7 = local_88;
    iVar13 = mi_row_00;
    pMVar18 = x_00;
    iVar8 = delay_wait_for_top_right_sb((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff0c,local_a4));
    (*p_Var12)((AV1EncRowMultiThreadSync *)x_00,mi_row_00,iVar7 - iVar8);
    uVar10 = in_stack_ffffffffffffff20;
    if (bVar4 != 0) {
      pthread_mutex_lock((pthread_mutex_t *)(in_RDI->mt_info).enc_row_mt.mutex_);
      _Var2 = (in_RDI->mt_info).enc_row_mt.row_mt_exit;
      pthread_mutex_unlock((pthread_mutex_t *)(in_RDI->mt_info).enc_row_mt.mutex_);
      uVar10 = in_stack_ffffffffffffff20;
      if ((_Var2 & 1U) != 0) {
        return;
      }
    }
    in_stack_ffffffffffffff20 = uVar10 & 0xffffff;
    if ((char)in_RDX[0x377].mi_col_start != '\0') {
      in_stack_ffffffffffffff20 = CONCAT13(_Var1,(int3)uVar10) & 0x1ffffff;
    }
    cVar11 = (char)(in_stack_ffffffffffffff20 >> 0x18);
    if ((cVar11 != '\0') && (in_RDX->mi_row_start != in_ECX)) {
      if (in_RDX->mi_col_start == local_84) {
        memcpy(*(void **)(pTVar17->mb).e_mbd.weight[4],
               *(void **)(cpi_00->enc_quant_dequant_params).quants.y_quant_fp[0x17],0x52fc);
      }
      else if (local_84 + iVar15 < in_RDX->mi_col_end) {
        av1_avg_cdf_symbols(in_stack_00000620,in_stack_00000618,in_stack_00000614,in_stack_00000610)
        ;
      }
      else {
        av1_avg_cdf_symbols(in_stack_00000620,in_stack_00000618,in_stack_00000614,in_stack_00000610)
        ;
      }
    }
    av1_set_cost_upd_freq
              (in_stack_ffffffffffffff50,
               (ThreadData_conflict *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
               (TileInfo *)in_stack_ffffffffffffff40,(int)((ulong)p_Var12 >> 0x20),(int)p_Var12);
    memset((cpi_00->td).mb.coeff_costs.coeff_costs[2][1].base_cost + 0xe,0,2);
    memset((void *)((long)((cpi_00->td).mb.coeff_costs.coeff_costs[2][1].base_cost + 0xe) + 2),0,2);
    memset((void *)((long)((cpi_00->td).mb.coeff_costs.coeff_costs[2][1].base_cost + 0xe) + 4),0,2);
    memset((void *)((long)((cpi_00->td).mb.coeff_costs.coeff_costs[2][1].base_cost + 0xe) + 6),0,2);
    *(undefined4 *)((cpi_00->td).mb.e_mbd.plane[1].seg_iqmatrix[1] + 1) = 3;
    *(undefined4 *)((long)(cpi_00->td).mb.e_mbd.plane[1].seg_iqmatrix[1] + 0xc) = 3;
    *(undefined4 *)((cpi_00->td).mb.e_mbd.plane[1].seg_iqmatrix[1] + 2) = 0;
    *(undefined4 *)((long)(cpi_00->td).mb.e_mbd.plane[1].seg_iqmatrix[1] + 0x14) = 0;
    (cpi_00->td).mb.e_mbd.plane[0].pre[1].width = 0;
    *(int *)((long)((cpi_00->td).mb.coeff_costs.coeff_costs[2][1].base_cost + 0xf) + 0xc) = 0;
    *(int *)((long)((cpi_00->td).mb.coeff_costs.coeff_costs[2][1].base_cost + 0xf) + 8) = 0;
    *(int *)((long)((cpi_00->td).mb.coeff_costs.coeff_costs[2][1].base_cost + 0xf) + 0x18) = 0;
    *(int *)((long)((cpi_00->td).mb.coeff_costs.coeff_costs[2][1].base_cost + 0xf) + 0x10) = 0;
    *(int *)((long)((cpi_00->td).mb.coeff_costs.coeff_costs[2][1].base_cost + 0xf) + 0x14) = 0;
    *(int *)((long)((cpi_00->td).mb.coeff_costs.coeff_costs[2][1].base_cost + 0xf) + 0x1c) = 1;
    *(int *)((long)((cpi_00->td).mb.coeff_costs.coeff_costs[2][1].base_cost + 0xe) + 0x10) = 0x40;
    *(int *)((long)((cpi_00->td).mb.coeff_costs.coeff_costs[2][1].base_cost + 0xe) + 0x14) = 0;
    *(int *)(cpi_00->td).mb.e_mbd.wiener_info[2].vfilter =
         (in_RDI->sf).rt_sf.nonrd_prune_ref_frame_search;
    if ((in_RDI->oxcf).mode == '\x02') {
      paiVar3 = (cpi_00->enc_quant_dequant_params).quants.y_quant_fp;
      *(int16_t *)((long)(paiVar3 + 0x20) + 0xc) = 0x80;
      *(int16_t *)((long)(paiVar3 + 0x20) + 0xe) = 0;
    }
    *(uint *)(pTVar17->mb).e_mbd.weight[9] =
         (uint)((in_RDI->common).features.cur_frame_force_integer_mv & 1);
    (cpi_00->td).mb.coeff_costs.coeff_costs[2][1].base_cost[0xf][0] = -1;
    pCVar9 = av1_get_cb_coeff_buffer(in_RDI,in_ECX,local_84);
    *(CB_COEFF_BUFFER **)(in_RSI->enc_quant_dequant_params).quants.y_quant_fp[0x18] = pCVar9;
    seg_00 = &(in_RDI->common).seg;
    local_a4 = 0;
    if (seg_00->enabled != '\0') {
      if ((in_RDI->common).seg.update_map == '\0') {
        in_stack_ffffffffffffff18 = (AV1_COMP *)(in_RDI->common).last_frame_seg_map;
      }
      else {
        in_stack_ffffffffffffff18 = (AV1_COMP *)(in_RDI->enc_seg).map;
      }
      in_stack_ffffffffffffff50 = in_stack_ffffffffffffff18;
      if (in_stack_ffffffffffffff18 == (AV1_COMP *)0x0) {
        in_stack_ffffffffffffff14 = 0;
      }
      else {
        bVar5 = get_segment_id(&(in_RDI->common).mi_params,(uint8_t *)in_stack_ffffffffffffff18,
                               (BLOCK_SIZE)((uint)uVar16 >> 0x18),in_ECX,local_84);
        in_stack_ffffffffffffff14 = (uint)bVar5;
      }
      in_stack_ffffffffffffff4f = (uint8_t)in_stack_ffffffffffffff14;
      local_a4 = segfeature_active(seg_00,in_stack_ffffffffffffff4f,'\x06');
    }
    produce_gradients_for_sb
              ((AV1_COMP *)CONCAT44(mi_row_00,in_stack_ffffffffffffff30),x_00,
               (BLOCK_SIZE)((uint)iVar7 >> 0x18),in_stack_ffffffffffffff20,
               (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    init_src_var_info_of_4x4_sub_blocks
              ((AV1_COMP *)CONCAT44(iVar7,in_stack_ffffffffffffff20),
               (Block4x4VarInfo *)in_stack_ffffffffffffff18,
               (BLOCK_SIZE)(in_stack_ffffffffffffff14 >> 0x18));
    if (local_a4 == 0) {
      grade_source_content_sb
                ((AV1_COMP *)CONCAT44(mi_row_00,in_stack_ffffffffffffff30),x_00,
                 (TileDataEnc *)CONCAT44(iVar7,in_stack_ffffffffffffff20),
                 (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),(int)in_stack_ffffffffffffff18);
    }
    x_00 = pMVar18;
    mi_row_00 = iVar13;
    if (mi_col_00 == 0) {
      encode_rd_sb((AV1_COMP *)map,in_stack_00000040,in_stack_00000038,in_stack_00000030,
                   in_stack_0000002c,in_stack_00000028,sb_col_in_tile);
    }
    else {
      encode_nonrd_sb(cpi_00,pTVar17,(TileDataEnc *)CONCAT44(iVar6,uVar16),
                      (TokenExtra **)CONCAT44(iVar15,iVar14),mi_row_00,mi_col_00,(int)x_00);
    }
    if ((cVar11 != '\0') && (in_ECX + iVar15 < in_RDX->mi_row_end)) {
      if (iVar6 == 1) {
        memcpy(*(void **)(cpi_00->enc_quant_dequant_params).quants.y_quant_fp[0x17],
               *(void **)(pTVar17->mb).e_mbd.weight[4],0x52fc);
      }
      else if (0 < local_88) {
        memcpy((void *)(*(long *)(cpi_00->enc_quant_dequant_params).quants.y_quant_fp[0x17] +
                       ((long)local_88 + -1) * 0x52fc),*(void **)(pTVar17->mb).e_mbd.weight[4],
               0x52fc);
      }
    }
    (*(in_RDI->mt_info).enc_row_mt.sync_write_ptr)
              ((AV1EncRowMultiThreadSync *)x_00,mi_row_00,local_88,iVar6);
    local_84 = iVar15 + local_84;
    local_88 = local_88 + 1;
  } while( true );
}

Assistant:

static inline void encode_sb_row(AV1_COMP *cpi, ThreadData *td,
                                 TileDataEnc *tile_data, int mi_row,
                                 TokenExtra **tp) {
  AV1_COMMON *const cm = &cpi->common;
  const TileInfo *const tile_info = &tile_data->tile_info;
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  AV1EncRowMultiThreadInfo *const enc_row_mt = &mt_info->enc_row_mt;
  AV1EncRowMultiThreadSync *const row_mt_sync = &tile_data->row_mt_sync;
  bool row_mt_enabled = mt_info->row_mt_enabled;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  const int sb_cols_in_tile = av1_get_sb_cols_in_tile(cm, tile_info);
  const BLOCK_SIZE sb_size = cm->seq_params->sb_size;
  const int mib_size = cm->seq_params->mib_size;
  const int mib_size_log2 = cm->seq_params->mib_size_log2;
  const int sb_row = (mi_row - tile_info->mi_row_start) >> mib_size_log2;
  const int use_nonrd_mode = cpi->sf.rt_sf.use_nonrd_pick_mode;

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, encode_sb_row_time);
#endif

  // Initialize the left context for the new SB row
  av1_zero_left_context(xd);

  // Reset delta for quantizer and loof filters at the beginning of every tile
  if (mi_row == tile_info->mi_row_start || row_mt_enabled) {
    if (cm->delta_q_info.delta_q_present_flag)
      xd->current_base_qindex = cm->quant_params.base_qindex;
    if (cm->delta_q_info.delta_lf_present_flag) {
      av1_reset_loop_filter_delta(xd, av1_num_planes(cm));
    }
  }

  reset_thresh_freq_fact(x);

  // Code each SB in the row
  for (int mi_col = tile_info->mi_col_start, sb_col_in_tile = 0;
       mi_col < tile_info->mi_col_end; mi_col += mib_size, sb_col_in_tile++) {
    // In realtime/allintra mode and when frequency of cost updates is off/tile,
    // wait for the top superblock to finish encoding. Otherwise, wait for the
    // top-right superblock to finish encoding.
    enc_row_mt->sync_read_ptr(
        row_mt_sync, sb_row, sb_col_in_tile - delay_wait_for_top_right_sb(cpi));

#if CONFIG_MULTITHREAD
    if (row_mt_enabled) {
      pthread_mutex_lock(enc_row_mt->mutex_);
      const bool row_mt_exit = enc_row_mt->row_mt_exit;
      pthread_mutex_unlock(enc_row_mt->mutex_);
      // Exit in case any worker has encountered an error.
      if (row_mt_exit) return;
    }
#endif

    const int update_cdf = tile_data->allow_update_cdf && row_mt_enabled;
    if (update_cdf && (tile_info->mi_row_start != mi_row)) {
      if ((tile_info->mi_col_start == mi_col)) {
        // restore frame context at the 1st column sb
        memcpy(xd->tile_ctx, x->row_ctx, sizeof(*xd->tile_ctx));
      } else {
        // update context
        int wt_left = AVG_CDF_WEIGHT_LEFT;
        int wt_tr = AVG_CDF_WEIGHT_TOP_RIGHT;
        if (tile_info->mi_col_end > (mi_col + mib_size))
          av1_avg_cdf_symbols(xd->tile_ctx, x->row_ctx + sb_col_in_tile,
                              wt_left, wt_tr);
        else
          av1_avg_cdf_symbols(xd->tile_ctx, x->row_ctx + sb_col_in_tile - 1,
                              wt_left, wt_tr);
      }
    }

    // Update the rate cost tables for some symbols
    av1_set_cost_upd_freq(cpi, td, tile_info, mi_row, mi_col);

    // Reset color coding related parameters
    av1_zero(x->color_sensitivity_sb);
    av1_zero(x->color_sensitivity_sb_g);
    av1_zero(x->color_sensitivity_sb_alt);
    av1_zero(x->color_sensitivity);
    x->content_state_sb.source_sad_nonrd = kMedSad;
    x->content_state_sb.source_sad_rd = kMedSad;
    x->content_state_sb.lighting_change = 0;
    x->content_state_sb.low_sumdiff = 0;
    x->force_zeromv_skip_for_sb = 0;
    x->sb_me_block = 0;
    x->sb_me_partition = 0;
    x->sb_me_mv.as_int = 0;
    x->sb_col_scroll = 0;
    x->sb_row_scroll = 0;
    x->sb_force_fixed_part = 1;
    x->color_palette_thresh = 64;
    x->force_color_check_block_level = 0;
    x->nonrd_prune_ref_frame_search =
        cpi->sf.rt_sf.nonrd_prune_ref_frame_search;

    if (cpi->oxcf.mode == ALLINTRA) {
      x->intra_sb_rdmult_modifier = 128;
    }

    xd->cur_frame_force_integer_mv = cm->features.cur_frame_force_integer_mv;
    x->source_variance = UINT_MAX;
    td->mb.cb_coef_buff = av1_get_cb_coeff_buffer(cpi, mi_row, mi_col);

    // Get segment id and skip flag
    const struct segmentation *const seg = &cm->seg;
    int seg_skip = 0;
    if (seg->enabled) {
      const uint8_t *const map =
          seg->update_map ? cpi->enc_seg.map : cm->last_frame_seg_map;
      const uint8_t segment_id =
          map ? get_segment_id(&cm->mi_params, map, sb_size, mi_row, mi_col)
              : 0;
      seg_skip = segfeature_active(seg, segment_id, SEG_LVL_SKIP);
    }

    produce_gradients_for_sb(cpi, x, sb_size, mi_row, mi_col);

    init_src_var_info_of_4x4_sub_blocks(cpi, x->src_var_info_of_4x4_sub_blocks,
                                        sb_size);

    // Grade the temporal variation of the sb, the grade will be used to decide
    // fast mode search strategy for coding blocks
    if (!seg_skip) grade_source_content_sb(cpi, x, tile_data, mi_row, mi_col);

    // encode the superblock
    if (use_nonrd_mode) {
      encode_nonrd_sb(cpi, td, tile_data, tp, mi_row, mi_col, seg_skip);
    } else {
      encode_rd_sb(cpi, td, tile_data, tp, mi_row, mi_col, seg_skip);
    }

    // Update the top-right context in row_mt coding
    if (update_cdf && (tile_info->mi_row_end > (mi_row + mib_size))) {
      if (sb_cols_in_tile == 1)
        memcpy(x->row_ctx, xd->tile_ctx, sizeof(*xd->tile_ctx));
      else if (sb_col_in_tile >= 1)
        memcpy(x->row_ctx + sb_col_in_tile - 1, xd->tile_ctx,
               sizeof(*xd->tile_ctx));
    }
    enc_row_mt->sync_write_ptr(row_mt_sync, sb_row, sb_col_in_tile,
                               sb_cols_in_tile);
  }

#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, encode_sb_row_time);
#endif
}